

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O3

bool ON_NurbsArcToArcTransitionIsNotGsmooth
               (ON_NurbsCurve *nurbs_curve,int knot_index,double cos_angle_tolerance,
               double curvature_tolerance)

{
  int iVar1;
  double *pdVar2;
  bool bVar3;
  int iVar4;
  int i;
  ulong uVar5;
  ON_Plane *pOVar6;
  ON_Arc *pOVar7;
  long lVar8;
  long lVar9;
  byte bVar10;
  double dVar11;
  ON_Arc arc1;
  ON_Arc arc0;
  ON_NurbsCurve local_198;
  ON_Arc local_158;
  ON_Arc local_c0;
  
  uVar5 = (ulong)(uint)knot_index;
  bVar10 = 0;
  if (nurbs_curve->m_is_rat == 0) {
    return false;
  }
  iVar1 = nurbs_curve->m_order;
  if ((long)iVar1 < 3) {
    return false;
  }
  iVar4 = nurbs_curve->m_cv_count;
  if (iVar4 <= iVar1) {
    return false;
  }
  if (0 < knot_index) {
    uVar5 = (ulong)(uint)knot_index;
    do {
      dVar11 = nurbs_curve->m_knot[uVar5 - 1];
      pdVar2 = nurbs_curve->m_knot + uVar5;
      if ((dVar11 != *pdVar2) || (NAN(dVar11) || NAN(*pdVar2))) goto LAB_00587ffd;
      bVar3 = 1 < (long)uVar5;
      uVar5 = uVar5 - 1;
    } while (bVar3);
    uVar5 = 0;
  }
LAB_00587ffd:
  i = (int)uVar5;
  if (i <= iVar1 + -2) {
    return false;
  }
  if (iVar4 + -1 <= i) {
    return false;
  }
  pdVar2 = nurbs_curve->m_knot;
  lVar9 = (long)i;
  dVar11 = pdVar2[lVar9];
  if (dVar11 < pdVar2[(long)iVar1 + -2] || dVar11 == pdVar2[(long)iVar1 + -2]) {
    return false;
  }
  if (pdVar2[(long)iVar4 + -1] <= dVar11) {
    return false;
  }
  iVar4 = i + iVar1;
  if (dVar11 != pdVar2[(long)iVar4 + -2]) {
    return false;
  }
  if (NAN(dVar11) || NAN(pdVar2[(long)iVar4 + -2])) {
    return false;
  }
  if (pdVar2[(long)(i - iVar1) + 1] != pdVar2[lVar9 + -1]) {
    return false;
  }
  if (NAN(pdVar2[(long)(i - iVar1) + 1]) || NAN(pdVar2[lVar9 + -1])) {
    return false;
  }
  if (pdVar2[(long)iVar4 + -1] != pdVar2[(long)(iVar1 + iVar4 + -1) + -2]) {
    return false;
  }
  if (NAN(pdVar2[(long)iVar4 + -1]) || NAN(pdVar2[(long)(iVar1 + iVar4 + -1) + -2])) {
    return false;
  }
  dVar11 = ON_NurbsCurve::Weight(nurbs_curve,i);
  if (dVar11 != 1.0) {
    return false;
  }
  if (NAN(dVar11)) {
    return false;
  }
  lVar8 = (long)(i - iVar1) + 1;
  ON_NurbsCurve::ON_NurbsCurve(&local_198);
  local_198.m_dim = nurbs_curve->m_dim;
  local_198.m_is_rat = nurbs_curve->m_is_rat;
  local_198.m_order = nurbs_curve->m_order;
  local_198.m_cv_stride = nurbs_curve->m_cv_stride;
  local_198.m_knot = nurbs_curve->m_knot + lVar8;
  local_198.m_cv = nurbs_curve->m_cv + (int)lVar8 * local_198.m_cv_stride;
  pOVar6 = &ON_Plane::World_xy;
  pOVar7 = &local_c0;
  for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
    (pOVar7->super_ON_Circle).plane.origin.x = (pOVar6->origin).x;
    pOVar6 = (ON_Plane *)((long)pOVar6 + ((ulong)bVar10 * -2 + 1) * 8);
    pOVar7 = (ON_Arc *)((long)pOVar7 + ((ulong)bVar10 * -2 + 1) * 8);
  }
  local_c0.super_ON_Circle.radius = 1.0;
  local_c0.m_angle.m_t[0] = ON_Interval::ZeroToTwoPi.m_t[0];
  local_c0.m_angle.m_t[1] = ON_Interval::ZeroToTwoPi.m_t[1];
  local_198.m_cv_count = local_198.m_order;
  bVar3 = ON_NurbsCurve::IsLinear(&local_198,2.3283064365386963e-10);
  if ((!bVar3) &&
     (bVar3 = ON_NurbsCurve::IsArc(&local_198,(ON_Plane *)0x0,&local_c0,2.3283064365386963e-10),
     bVar3)) {
    pOVar6 = &ON_Plane::World_xy;
    pOVar7 = &local_158;
    for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
      (pOVar7->super_ON_Circle).plane.origin.x = (pOVar6->origin).x;
      pOVar6 = (ON_Plane *)((long)pOVar6 + ((ulong)bVar10 * -2 + 1) * 8);
      pOVar7 = (ON_Arc *)((long)pOVar7 + ((ulong)bVar10 * -2 + 1) * 8);
    }
    local_158.super_ON_Circle.radius = 1.0;
    local_158.m_angle.m_t[0] = ON_Interval::ZeroToTwoPi.m_t[0];
    local_158.m_angle.m_t[1] = ON_Interval::ZeroToTwoPi.m_t[1];
    local_198.m_knot = nurbs_curve->m_knot + lVar9;
    local_198.m_cv = nurbs_curve->m_cv + nurbs_curve->m_cv_stride * lVar9;
    bVar3 = ON_NurbsCurve::IsLinear(&local_198,2.3283064365386963e-10);
    if (((!bVar3) &&
        (bVar3 = ON_NurbsCurve::IsArc
                           (&local_198,(ON_Plane *)&local_c0,&local_158,2.3283064365386963e-10),
        bVar3)) &&
       (bVar3 = ON_ArcToArcTransitionIsNotGsmooth
                          (&local_c0,&local_158,cos_angle_tolerance,curvature_tolerance), bVar3)) {
      ON_Plane::~ON_Plane((ON_Plane *)&local_158);
      bVar3 = true;
      goto LAB_00588267;
    }
    ON_Plane::~ON_Plane((ON_Plane *)&local_158);
  }
  bVar3 = false;
  local_198.m_knot = (double *)0x0;
  local_198.m_cv = (double *)0x0;
LAB_00588267:
  ON_Plane::~ON_Plane((ON_Plane *)&local_c0);
  ON_NurbsCurve::~ON_NurbsCurve(&local_198);
  return bVar3;
}

Assistant:

static bool ON_NurbsArcToArcTransitionIsNotGsmooth(
  const ON_NurbsCurve& nurbs_curve,
  int knot_index,
  double cos_angle_tolerance,
  double curvature_tolerance
  )
{
  if ( 0 == nurbs_curve.m_is_rat )
    return false;
  if ( nurbs_curve.m_order < 3 )
    return false;
  if ( nurbs_curve.m_cv_count <= nurbs_curve.m_order )
    return false;
  while ( knot_index > 0 && nurbs_curve.m_knot[knot_index-1] == nurbs_curve.m_knot[knot_index] )
    knot_index--;
  if ( knot_index <= nurbs_curve.m_order-2 )
    return false;
  if ( knot_index >= nurbs_curve.m_cv_count-1 )
    return false;
  if ( !(nurbs_curve.m_knot[knot_index] > nurbs_curve.m_knot[nurbs_curve.m_order-2]) )
    return false;
  if ( !(nurbs_curve.m_knot[knot_index] < nurbs_curve.m_knot[nurbs_curve.m_cv_count-1]) )
    return false;
  if ( !(nurbs_curve.m_knot[knot_index] == nurbs_curve.m_knot[knot_index+nurbs_curve.m_order-2]) )
    return false;
  int k0 = knot_index-nurbs_curve.m_order+1;
  if ( !(nurbs_curve.m_knot[k0] == nurbs_curve.m_knot[k0+nurbs_curve.m_order-2]) )
    return false;
  int k1 = knot_index+nurbs_curve.m_order-1;
  if ( !(nurbs_curve.m_knot[k1] == nurbs_curve.m_knot[k1+nurbs_curve.m_order-2]) )
    return false;
  if ( !(1.0 == nurbs_curve.Weight(knot_index)) )
    return false;

  ON_NurbsCurve span;
  span.m_dim = nurbs_curve.m_dim;
  span.m_is_rat = nurbs_curve.m_is_rat;
  span.m_order = nurbs_curve.m_order;
  span.m_cv_count = nurbs_curve.m_order; // no typo here, I want m_cv_count = nurbs_curve.m_order
  span.m_cv_stride = nurbs_curve.m_cv_stride;
  span.m_knot = nurbs_curve.m_knot + k0;
  span.m_cv = nurbs_curve.m_cv + k0*nurbs_curve.m_cv_stride;

  bool rc = false;
  ON_Arc arc0;
  if ( !span.IsLinear(ON_ZERO_TOLERANCE) && span.IsArc(0,&arc0) )
  {
    ON_Arc arc1;
    span.m_knot = nurbs_curve.m_knot + knot_index;
    span.m_cv = nurbs_curve.m_cv + knot_index*nurbs_curve.m_cv_stride;
    if ( !span.IsLinear(ON_ZERO_TOLERANCE) && span.IsArc(&arc0.plane,&arc1) )
    {
      if ( ON_ArcToArcTransitionIsNotGsmooth(arc0,arc1,cos_angle_tolerance,curvature_tolerance) )
        return true;
    }
  }

  span.m_knot = 0;
  span.m_cv = 0;

  return rc;
}